

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

int htmlEncodeEntities(uchar *out,int *outlen,uchar *in,int *inlen,int quoteChar)

{
  byte bVar1;
  int iVar2;
  uchar *puVar3;
  long lVar4;
  size_t sVar5;
  uint uVar6;
  uchar *processed;
  byte *pbVar7;
  uint uVar8;
  uchar *outstart;
  undefined4 in_R9D;
  int iVar9;
  byte *pbVar10;
  char *__s;
  byte *pbVar11;
  int iVar12;
  undefined1 auVar13 [16];
  char nbuf [16];
  char local_48 [24];
  
  iVar12 = (int)out;
  auVar13._0_4_ = -(uint)(out == (uchar *)0x0);
  auVar13._4_4_ = -(uint)(outlen == (int *)0x0);
  auVar13._8_4_ = -(uint)(inlen == (int *)0x0);
  auVar13._12_4_ = -(uint)(in == (uchar *)0x0);
  iVar9 = movmskps(in_R9D,auVar13);
  if (iVar9 != 0) {
    return -1;
  }
  pbVar11 = in;
  if ((long)*inlen < 1) {
    iVar2 = 0;
    iVar9 = iVar12;
  }
  else {
    puVar3 = out + *outlen;
    pbVar10 = in + *inlen;
    do {
      pbVar7 = pbVar11 + 1;
      bVar1 = *pbVar11;
      uVar6 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        iVar2 = -2;
        if (bVar1 < 0xc0) goto LAB_0014a9c7;
        if (bVar1 < 0xe0) {
          uVar8 = 1;
          uVar6 = 0x1f;
        }
        else if (bVar1 < 0xf0) {
          uVar8 = 2;
          uVar6 = 0xf;
        }
        else {
          if (0xf7 < bVar1) goto LAB_0014a9c7;
          uVar8 = 3;
          uVar6 = 7;
        }
        if ((long)pbVar10 - (long)pbVar7 < (long)(ulong)uVar8) break;
        uVar6 = uVar6 & bVar1;
        if ((char)bVar1 < '\0') {
          pbVar7 = pbVar11 + (ulong)uVar8 + 1;
          lVar4 = 0;
          do {
            if ((pbVar11[lVar4 + 1] & 0xffffffc0) != 0x80) goto LAB_0014a9c7;
            uVar6 = pbVar11[lVar4 + 1] & 0x3f | uVar6 << 6;
            lVar4 = lVar4 + 1;
          } while (uVar8 != (uint)lVar4);
          goto LAB_0014a84b;
        }
LAB_0014a8b5:
        if ((uVar6 & 0x7d) == 0x3c || (uVar6 == 0x26 || uVar6 == quoteChar)) goto LAB_0014a8e9;
        if (puVar3 <= out) break;
        *out = (uchar)uVar6;
      }
      else {
        if ((long)pbVar10 - (long)pbVar7 < 0) break;
LAB_0014a84b:
        if (uVar6 < 0x80) goto LAB_0014a8b5;
LAB_0014a8e9:
        lVar4 = 8;
        do {
          uVar8 = *(uint *)((long)&html40ElementTable[0x5b].attrs_req + lVar4);
          if (uVar6 <= uVar8) {
            if (uVar8 <= uVar6) {
              __s = *(char **)((long)&html40EntitiesTable[0].value + lVar4);
              goto LAB_0014a926;
            }
            break;
          }
          lVar4 = lVar4 + 0x18;
        } while (lVar4 != 0x17c0);
        __s = local_48;
        snprintf(__s,0x10,"#%u");
LAB_0014a926:
        sVar5 = strlen(__s);
        sVar5 = (size_t)(int)sVar5;
        if (puVar3 < out + sVar5 + 2) break;
        *out = '&';
        memcpy(out + 1,__s,sVar5);
        out = out + sVar5 + 1;
        *out = ';';
      }
      out = out + 1;
      pbVar11 = pbVar7;
    } while (pbVar7 < pbVar10);
    iVar2 = 0;
LAB_0014a9c7:
    iVar9 = (int)out;
  }
  *outlen = iVar9 - iVar12;
  *inlen = (int)pbVar11 - (int)in;
  return iVar2;
}

Assistant:

int
htmlEncodeEntities(unsigned char* out, int *outlen,
		   const unsigned char* in, int *inlen, int quoteChar) {
    const unsigned char* processed = in;
    const unsigned char* outend;
    const unsigned char* outstart = out;
    const unsigned char* instart = in;
    const unsigned char* inend;
    unsigned int c, d;
    int trailing;

    if ((out == NULL) || (outlen == NULL) || (inlen == NULL) || (in == NULL))
        return(-1);
    outend = out + (*outlen);
    inend = in + (*inlen);
    while (in < inend) {
	d = *in++;
	if      (d < 0x80)  { c= d; trailing= 0; }
	else if (d < 0xC0) {
	    /* trailing byte in leading position */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
        } else if (d < 0xE0)  { c= d & 0x1F; trailing= 1; }
        else if (d < 0xF0)  { c= d & 0x0F; trailing= 2; }
        else if (d < 0xF8)  { c= d & 0x07; trailing= 3; }
	else {
	    /* no chance for this in Ascii */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
	}

	if (inend - in < trailing)
	    break;

	while (trailing--) {
	    if (((d= *in++) & 0xC0) != 0x80) {
		*outlen = out - outstart;
		*inlen = processed - instart;
		return(-2);
	    }
	    c <<= 6;
	    c |= d & 0x3F;
	}

	/* assertion: c is a single UTF-4 value */
	if ((c < 0x80) && (c != (unsigned int) quoteChar) &&
	    (c != '&') && (c != '<') && (c != '>')) {
	    if (out >= outend)
		break;
	    *out++ = c;
	} else {
	    const htmlEntityDesc * ent;
	    const char *cp;
	    char nbuf[16];
	    int len;

	    /*
	     * Try to lookup a predefined HTML entity for it
	     */
	    ent = htmlEntityValueLookup(c);
	    if (ent == NULL) {
		snprintf(nbuf, sizeof(nbuf), "#%u", c);
		cp = nbuf;
	    }
	    else
		cp = ent->name;
	    len = strlen(cp);
	    if (out + 2 + len > outend)
		break;
	    *out++ = '&';
	    memcpy(out, cp, len);
	    out += len;
	    *out++ = ';';
	}
	processed = in;
    }
    *outlen = out - outstart;
    *inlen = processed - instart;
    return(0);
}